

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void int_trp_assert_error(char *exp,char *file,int line)

{
  element_type *this;
  TestResponseProxy *this_00;
  shared_ptr<trun::TestModule> local_30;
  int local_1c;
  char *pcStack_18;
  int line_local;
  char *file_local;
  char *exp_local;
  
  local_1c = line;
  pcStack_18 = file;
  file_local = exp;
  trun::TestRunner::GetCurrentTestModule();
  this = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)&local_30);
  this_00 = trun::TestModule::GetTestResponseProxy(this);
  trun::TestResponseProxy::AssertError(this_00,file_local,pcStack_18,local_1c);
  std::shared_ptr<trun::TestModule>::~shared_ptr(&local_30);
  return;
}

Assistant:

static void int_trp_assert_error(const char *exp, const char *file, int line) {
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().AssertError(exp, file, line);
}